

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalarN
               (char *label,ImGuiDataType data_type,void *v,int components,void *v_min,void *v_max,
               char *format,float power)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  int in_ECX;
  int in_ESI;
  char *in_RDI;
  char *label_end;
  int i;
  size_t type_size;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiTextFlags in_stack_000000b4;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  float in_stack_0000011c;
  char *in_stack_00000120;
  void *in_stack_00000128;
  void *in_stack_00000130;
  void *in_stack_00000138;
  ImGuiDataType in_stack_00000144;
  char *in_stack_00000148;
  undefined8 in_stack_ffffffffffffff90;
  int local_64;
  char *in_stack_ffffffffffffffa0;
  size_t sVar4;
  ImGuiContext *pIVar5;
  bool local_1;
  
  pIVar2 = GetCurrentWindow();
  if ((pIVar2->SkipItems & 1U) == 0) {
    local_1 = false;
    pIVar5 = GImGui;
    BeginGroup();
    PushID(in_stack_ffffffffffffffa0);
    CalcItemWidth();
    PushMultiItemsWidths((int)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
    sVar4 = GDataTypeInfo[in_ESI].Size;
    for (local_64 = 0; local_64 < in_ECX; local_64 = local_64 + 1) {
      PushID((int)(sVar4 >> 0x20));
      if (0 < local_64) {
        SameLine((float)((ulong)in_stack_ffffffffffffff90 >> 0x20),(float)in_stack_ffffffffffffff90)
        ;
      }
      bVar1 = SliderScalar(in_stack_00000148,in_stack_00000144,in_stack_00000138,in_stack_00000130,
                           in_stack_00000128,in_stack_00000120,in_stack_0000011c);
      local_1 = local_1 != false || bVar1;
      PopID();
      PopItemWidth();
    }
    PopID();
    pcVar3 = FindRenderedTextEnd(in_RDI,(char *)0x0);
    if (in_RDI != pcVar3) {
      SameLine((float)((ulong)pcVar3 >> 0x20),SUB84(pcVar3,0));
      TextEx(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
    }
    EndGroup();
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= SliderScalar("", data_type, v, v_min, v_max, format, power);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}